

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O1

void __thiscall picojson::value::value(value *this,value *x)

{
  int iVar1;
  array *paVar2;
  pointer pvVar3;
  string *this_00;
  
  iVar1 = x->type_;
  this->type_ = iVar1;
  switch(iVar1) {
  case 1:
    (this->field_1).boolean_ = (x->field_1).boolean_;
    return;
  case 2:
    this->field_1 = x->field_1;
    return;
  case 3:
    this_00 = (string *)operator_new(0x20);
    paVar2 = (x->field_1).array_;
    (this_00->_M_dataplus)._M_p = (pointer)&this_00->field_2;
    pvVar3 = (paVar2->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl
             .super__Vector_impl_data._M_start;
    std::__cxx11::string::_M_construct<char*>
              ((string *)this_00,pvVar3,
               (long)&((paVar2->
                       super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
                       _M_impl.super__Vector_impl_data._M_finish)->type_ + (long)pvVar3);
    break;
  case 4:
    this_00 = (string *)operator_new(0x18);
    std::vector<picojson::value,_std::allocator<picojson::value>_>::vector
              ((vector<picojson::value,_std::allocator<picojson::value>_> *)this_00,
               (vector<picojson::value,_std::allocator<picojson::value>_> *)(x->field_1).string_);
    break;
  case 5:
    this_00 = (string *)operator_new(0x30);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                *)this_00,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                *)(x->field_1).string_);
    break;
  default:
    goto switchD_00106732_default;
  }
  (this->field_1).string_ = this_00;
switchD_00106732_default:
  return;
}

Assistant:

inline value::value(const value& x) : type_(x.type_) {
    switch (type_) {
#define INIT(p, v) case p##type: p = v; break
      INIT(boolean_, x.boolean_);
      INIT(number_, x.number_);
      INIT(string_, new std::string(*x.string_));
      INIT(array_, new array(*x.array_));
      INIT(object_, new object(*x.object_));
#undef INIT
    default: break;
    }
  }